

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filename_encoding.c
# Opt level: O0

void test_ustar_filename_encoding_CP932_UTF8(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a_00;
  size_t local_1020;
  size_t used;
  char buff [4096];
  archive_entry *entry;
  archive *a;
  
  pcVar2 = setlocale(6,"Japanese_Japan");
  if ((pcVar2 == (char *)0x0) && (pcVar2 = setlocale(6,"ja_JP.SJIS"), pcVar2 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'ũ');
    test_skipping("CP932/SJIS locale not available on this system.");
    return;
  }
  a_00 = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_ustar((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                      ,L'ű',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options((archive *)a_00,"hdrcharset=UTF-8");
  if (iVar1 == 0) {
    iVar1 = archive_write_open_memory((archive *)a_00,&used,0x1000,&local_1020);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ź',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    buff._4088_8_ = archive_entry_new2(a_00);
    archive_entry_set_pathname((archive_entry *)buff._4088_8_,anon_var_dwarf_34352 + 0xb);
    archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
    archive_entry_set_size((archive_entry *)buff._4088_8_,0);
    iVar1 = archive_write_header((archive *)a_00,(archive_entry *)buff._4088_8_);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ɓ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free((archive_entry *)buff._4088_8_);
    iVar1 = archive_write_free((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ƃ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ɔ',&used,"buff",anon_var_dwarf_1f9dc + 0x10,"\"\\xE8\\xA1\\xA8.txt\"",7,
                        "7",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'ų');
    test_skipping("This system cannot convert character-set from CP932/SJIS to UTF-8.");
    archive_write_free((archive *)a_00);
  }
  return;
}

Assistant:

DEFINE_TEST(test_ustar_filename_encoding_CP932_UTF8)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "Japanese_Japan") &&
	    NULL == setlocale(LC_ALL, "ja_JP.SJIS")) {
		skipping("CP932/SJIS locale not available on this system.");
		return;
	}

	/*
	 * Verify that CP932/SJIS filenames are correctly translated to UTF-8.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_ustar(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from CP932/SJIS to UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a CP932/SJIS filename. */
	archive_entry_set_pathname(entry, "\x95\x5C.txt");
	/* Check the Unicode version. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Check UTF-8 version. */
	assertEqualMem(buff, "\xE8\xA1\xA8.txt", 7);
}